

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O3

int amqp_encode_field_value(amqp_bytes_t encoded,amqp_field_value_t *entry,size_t *offset)

{
  ulong uVar1;
  uint8_t uVar2;
  int8_t iVar3;
  ushort uVar4;
  ulong uVar5;
  uint64_t uVar6;
  size_t __n;
  void *__src;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  void *pvVar11;
  size_t sVar12;
  ulong uVar13;
  long lVar14;
  size_t o;
  
  pvVar11 = encoded.bytes;
  uVar13 = encoded.len;
  uVar2 = entry->kind;
  sVar12 = *offset;
  uVar1 = sVar12 + 1;
  *offset = uVar1;
  if (uVar13 < uVar1) {
    return -2;
  }
  *(uint8_t *)((long)pvVar11 + sVar12) = uVar2;
  uVar2 = entry->kind;
  iVar8 = -10;
  switch(uVar2) {
  case 'A':
    sVar12 = *offset;
    *offset = sVar12 + 4;
    if (0 < (entry->value).boolean) {
      lVar14 = 0;
      lVar10 = 0;
      do {
        iVar8 = amqp_encode_field_value
                          (encoded,(amqp_field_value_t *)((long)(entry->value).bytes.bytes + lVar14)
                           ,offset);
        if (iVar8 < 0) {
          return iVar8;
        }
        lVar10 = lVar10 + 1;
        lVar14 = lVar14 + 0x18;
      } while (lVar10 < (entry->value).boolean);
    }
    if (uVar13 < sVar12 + 4) {
      return -0xb;
    }
    uVar7 = ((int)*offset - (int)sVar12) - 4;
    *(uint *)((long)pvVar11 + sVar12) =
         uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 * 0x1000000;
    break;
  case 'B':
switchD_0010a80e_caseD_62:
    iVar3 = (entry->value).i8;
    sVar12 = *offset;
    uVar1 = sVar12 + 1;
    *offset = uVar1;
    if (uVar13 < uVar1) {
      return -0xb;
    }
    *(int8_t *)((long)pvVar11 + sVar12) = iVar3;
    break;
  case 'C':
  case 'E':
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'U':
    goto switchD_0010a80e_caseD_63;
  case 'D':
    iVar3 = (entry->value).i8;
    sVar12 = *offset;
    uVar1 = sVar12 + 1;
    *offset = uVar1;
    if (uVar13 < uVar1) {
      return -0xb;
    }
    *(int8_t *)((long)pvVar11 + sVar12) = iVar3;
    uVar7 = (entry->value).decimal.value;
    sVar9 = *offset;
    sVar12 = sVar9 + 4;
    *offset = sVar12;
    goto LAB_0010a888;
  case 'F':
    iVar8 = amqp_encode_table(encoded,&(entry->value).table,offset);
    return iVar8;
  case 'I':
switchD_0010a80e_caseD_66:
    uVar7 = (entry->value).u32;
    sVar9 = *offset;
    sVar12 = sVar9 + 4;
    *offset = sVar12;
LAB_0010a888:
    if (uVar13 < sVar12) {
      return -0xb;
    }
    *(uint *)((long)pvVar11 + sVar9) =
         uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    break;
  case 'L':
  case 'T':
switchD_0010a80e_caseD_64:
    uVar5 = (entry->value).u64;
    sVar12 = *offset;
    uVar1 = sVar12 + 8;
    *offset = uVar1;
    if (uVar13 < uVar1) {
      return -0xb;
    }
    *(ulong *)((long)pvVar11 + sVar12) =
         uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
         (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
         (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    break;
  case 'S':
switchD_0010a849_caseD_53:
    uVar6 = (entry->value).u64;
    sVar12 = *offset;
    uVar1 = sVar12 + 4;
    *offset = uVar1;
    if (uVar13 < uVar1) {
      return -0xb;
    }
    uVar7 = (uint)uVar6;
    *(uint *)((long)pvVar11 + sVar12) =
         uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    __n = (entry->value).u64;
    if (__n != 0) {
      __src = (entry->value).bytes.bytes;
      sVar12 = *offset;
      uVar1 = sVar12 + __n;
      *offset = uVar1;
      if (uVar13 < uVar1) {
        return -0xb;
      }
      memcpy((void *)((long)pvVar11 + sVar12),__src,__n);
    }
    break;
  case 'V':
    break;
  default:
    switch(uVar2) {
    case 'b':
      goto switchD_0010a80e_caseD_62;
    case 'c':
    case 'e':
    case 'g':
    case 'h':
    case 'j':
    case 'k':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
      goto switchD_0010a80e_caseD_63;
    case 'd':
    case 'l':
      goto switchD_0010a80e_caseD_64;
    case 'f':
    case 'i':
      goto switchD_0010a80e_caseD_66;
    case 's':
    case 'u':
      uVar4 = (entry->value).u16;
      sVar12 = *offset;
      uVar1 = sVar12 + 2;
      *offset = uVar1;
      if (uVar13 < uVar1) {
        return -0xb;
      }
      *(ushort *)((long)pvVar11 + sVar12) = uVar4 << 8 | uVar4 >> 8;
      break;
    case 't':
      iVar8 = (entry->value).boolean;
      sVar12 = *offset;
      uVar1 = sVar12 + 1;
      *offset = uVar1;
      if (uVar13 < uVar1) {
        return -0xb;
      }
      *(bool *)((long)pvVar11 + sVar12) = iVar8 != 0;
      break;
    default:
      if (uVar2 != 'x') {
        return -10;
      }
      goto switchD_0010a849_caseD_53;
    }
  }
  iVar8 = 0;
switchD_0010a80e_caseD_63:
  return iVar8;
}

Assistant:

static int amqp_encode_field_value(amqp_bytes_t encoded,
                                   amqp_field_value_t *entry, size_t *offset) {
  int res = AMQP_STATUS_BAD_AMQP_DATA;

  if (!amqp_encode_8(encoded, offset, entry->kind)) {
    goto out;
  }

#define FIELD_ENCODER(bits, val)                   \
  if (!amqp_encode_##bits(encoded, offset, val)) { \
    res = AMQP_STATUS_TABLE_TOO_BIG;               \
    goto out;                                      \
  }                                                \
  break

  switch (entry->kind) {
    case AMQP_FIELD_KIND_BOOLEAN:
      FIELD_ENCODER(8, entry->value.boolean ? 1 : 0);

    case AMQP_FIELD_KIND_I8:
      FIELD_ENCODER(8, entry->value.i8);
    case AMQP_FIELD_KIND_U8:
      FIELD_ENCODER(8, entry->value.u8);

    case AMQP_FIELD_KIND_I16:
      FIELD_ENCODER(16, entry->value.i16);
    case AMQP_FIELD_KIND_U16:
      FIELD_ENCODER(16, entry->value.u16);

    case AMQP_FIELD_KIND_I32:
      FIELD_ENCODER(32, entry->value.i32);
    case AMQP_FIELD_KIND_U32:
      FIELD_ENCODER(32, entry->value.u32);

    case AMQP_FIELD_KIND_I64:
      FIELD_ENCODER(64, entry->value.i64);
    case AMQP_FIELD_KIND_U64:
      FIELD_ENCODER(64, entry->value.u64);

    case AMQP_FIELD_KIND_F32:
      /* by punning, u32 magically gets the right value...! */
      FIELD_ENCODER(32, entry->value.u32);

    case AMQP_FIELD_KIND_F64:
      /* by punning, u64 magically gets the right value...! */
      FIELD_ENCODER(64, entry->value.u64);

    case AMQP_FIELD_KIND_DECIMAL:
      if (!amqp_encode_8(encoded, offset, entry->value.decimal.decimals) ||
          !amqp_encode_32(encoded, offset, entry->value.decimal.value)) {
        res = AMQP_STATUS_TABLE_TOO_BIG;
        goto out;
      }
      break;

    case AMQP_FIELD_KIND_UTF8:
    /* AMQP_FIELD_KIND_UTF8 and AMQP_FIELD_KIND_BYTES have the
       same implementation, but different interpretations. */
    /* fall through */
    case AMQP_FIELD_KIND_BYTES:
      if (!amqp_encode_32(encoded, offset, (uint32_t)entry->value.bytes.len) ||
          !amqp_encode_bytes(encoded, offset, entry->value.bytes)) {
        res = AMQP_STATUS_TABLE_TOO_BIG;
        goto out;
      }
      break;

    case AMQP_FIELD_KIND_ARRAY:
      res = amqp_encode_array(encoded, &entry->value.array, offset);
      goto out;

    case AMQP_FIELD_KIND_TIMESTAMP:
      FIELD_ENCODER(64, entry->value.u64);

    case AMQP_FIELD_KIND_TABLE:
      res = amqp_encode_table(encoded, &entry->value.table, offset);
      goto out;

    case AMQP_FIELD_KIND_VOID:
      break;

    default:
      res = AMQP_STATUS_INVALID_PARAMETER;
      goto out;
  }

  res = AMQP_STATUS_OK;

out:
  return res;
}